

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.cpp
# Opt level: O1

void __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
FreeAllocationHelper
          (Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
          Allocation *object,BVIndex index,uint length)

{
  BVUnit *pBVar1;
  Page *pPVar2;
  size_t sVar3;
  
  if (object->address != (char *)0x0) {
    pPVar2 = (object->field_0).page;
    memset(object->address,0xcc,object->size);
    if (DAT_015d346a == '\x01') {
      Output::Trace(CustomHeapPhase,
                    L"Setting %d bits starting at bit %d, Free bit vector in page was ",
                    (ulong)length,(ulong)index);
    }
    if (DAT_015d346a == '\x01') {
      Output::Trace(CustomHeapPhase,L"\n");
    }
    pBVar1 = &pPVar2->freeBitVector;
    pBVar1->word = pBVar1->word |
                   (0xffffffffffffffffU >> (-(char)length & 0x3fU)) << ((byte)index & 0x3f);
    if (DAT_015d346a == '\x01') {
      Output::Trace(CustomHeapPhase,L"Free bit vector in page: ",(ulong)length,(ulong)index);
    }
    if (DAT_015d346a == '\x01') {
      Output::Trace(CustomHeapPhase,L"\n");
    }
    sVar3 = object->size;
    this->freeObjectSize = this->freeObjectSize + sVar3;
    this->freesSinceLastCompact = this->freesSinceLastCompact + sVar3;
    ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              (&this->auxiliaryAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,object,0x38
              );
    return;
  }
  return;
}

Assistant:

void Heap<TAlloc, TPreReservedAlloc>::FreeAllocationHelper(Allocation* object, BVIndex index, uint length)
{
    Page* page = object->page;

    // Fill the old buffer with debug breaks
    char* localAddr = this->codePageAllocators->AllocLocal(object->address, object->size, page->segment);
    if (localAddr)
    {
        FillDebugBreak((BYTE*)localAddr, object->size);
        this->codePageAllocators->FreeLocal(localAddr, page->segment);
    }
    else
    {
        MemoryOperationLastError::RecordError(JSERR_FatalMemoryExhaustion);
        return;
    }
    VerboseHeapTrace(_u("Setting %d bits starting at bit %d, Free bit vector in page was "), length, index);
#if VERBOSE_HEAP
    page->freeBitVector.DumpWord();
#endif
    VerboseHeapTrace(_u("\n"));

    page->freeBitVector.SetRange(index, length);

    VerboseHeapTrace(_u("Free bit vector in page: "), length, index);
#if VERBOSE_HEAP
    page->freeBitVector.DumpWord();
#endif
    VerboseHeapTrace(_u("\n"));

#if DBG_DUMP
    this->freeObjectSize += object->size;
    this->freesSinceLastCompact += object->size;
#endif

    this->auxiliaryAllocator->Free(object, sizeof(Allocation));
}